

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadBones(OgreXmlSerializer *this,Skeleton *skeleton)

{
  aiVector3t<float> axis_00;
  bool bVar1;
  uint16_t uVar2;
  Logger *pLVar3;
  Bone *this_00;
  string *__lhs;
  reference ppBVar4;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  basic_formatter *pbVar6;
  DeadlyImportError *pDVar7;
  float fVar8;
  bool local_5a9;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string local_418;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_280;
  value_type local_260;
  Bone *b;
  size_t len;
  size_t i;
  __normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
  local_240;
  float local_234;
  undefined8 uStack_230;
  float factor;
  float local_228;
  undefined8 local_220;
  float local_218;
  aiQuaterniont<float> local_210;
  undefined1 local_200 [8];
  aiVector3D axis;
  string local_78;
  float local_54;
  undefined1 local_50 [4];
  float angle;
  Bone *local_20;
  Bone *bone;
  Skeleton *skeleton_local;
  OgreXmlSerializer *this_local;
  
  bone = (Bone *)skeleton;
  skeleton_local = (Skeleton *)this;
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"  - Bones");
  NextNode_abi_cxx11_(this);
  do {
    bVar1 = std::operator==(&this->m_currentNodeName,nnBone);
    if (!bVar1) {
      local_240._M_current =
           (Bone **)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::begin
                              ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                                *)bone);
      i = (size_t)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::end
                            ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)
                             bone);
      std::
      sort<__gnu_cxx::__normal_iterator<Assimp::Ogre::Bone**,std::vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>>>,bool(*)(Assimp::Ogre::Bone*,Assimp::Ogre::Bone*)>
                (local_240,
                 (__normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
                  )i,BoneCompare);
      len = 0;
      b = (Bone *)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::size
                            ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)
                             bone);
      while( true ) {
        if (b <= len) {
          return;
        }
        ppBVar4 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::
                  operator[]((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)
                             bone,len);
        local_260 = *ppBVar4;
        pLVar3 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[5]>(&local_3f8,(char (*) [5])"    ");
        pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_3f8,&local_260->id);
        pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar5,(char (*) [2])0xb6ea90);
        pbVar6 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar5,&local_260->name);
        Formatter::basic_formatter::operator_cast_to_string(&local_280,pbVar6);
        Logger::debug(pLVar3,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_3f8);
        if ((uint)local_260->id != ((uint)len & 0xffff)) break;
        len = len + 1;
      }
      pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter(&local_590);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_590,
                          (char (*) [61])
                          "Bone ids are not in sequence starting from 0. Missing index ");
      pbVar6 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar5,&len);
      Formatter::basic_formatter::operator_cast_to_string(&local_418,pbVar6);
      DeadlyImportError::DeadlyImportError(pDVar7,&local_418);
      __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this_00 = (Bone *)operator_new(0xf8);
    Bone::Bone(this_00);
    local_20 = this_00;
    uVar2 = ReadAttribute<unsigned_short>(this,"id");
    local_20->id = uVar2;
    ReadAttribute<std::__cxx11::string>((string *)local_50,this,"name");
    std::__cxx11::string::operator=((string *)&local_20->name,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    NextNode_abi_cxx11_(this);
    while( true ) {
      bVar1 = std::operator==(&this->m_currentNodeName,nnPosition);
      local_5a9 = true;
      if (!bVar1) {
        bVar1 = std::operator==(&this->m_currentNodeName,nnRotation);
        local_5a9 = true;
        if (!bVar1) {
          local_5a9 = std::operator==(&this->m_currentNodeName,nnScale);
        }
      }
      if (local_5a9 == false) break;
      bVar1 = std::operator==(&this->m_currentNodeName,nnPosition);
      if (bVar1) {
        fVar8 = ReadAttribute<float>(this,anX);
        (local_20->position).x = fVar8;
        fVar8 = ReadAttribute<float>(this,anY);
        (local_20->position).y = fVar8;
        fVar8 = ReadAttribute<float>(this,anZ);
        (local_20->position).z = fVar8;
      }
      else {
        bVar1 = std::operator==(&this->m_currentNodeName,nnRotation);
        if (bVar1) {
          local_54 = ReadAttribute<float>(this,"angle");
          __lhs = NextNode_abi_cxx11_(this);
          bVar1 = std::operator!=(__lhs,nnAxis);
          if (bVar1) {
            axis.y._3_1_ = 1;
            pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &axis.z);
            pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )&axis.z,(char (*) [45])
                                         "No axis specified for bone rotation in bone ");
            pbVar6 = (basic_formatter *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<(pbVar5,&local_20->id);
            Formatter::basic_formatter::operator_cast_to_string(&local_78,pbVar6);
            DeadlyImportError::DeadlyImportError(pDVar7,&local_78);
            axis.y._3_1_ = 0;
            __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_200);
          local_200._0_4_ = ReadAttribute<float>(this,anX);
          local_200._4_4_ = ReadAttribute<float>(this,anY);
          local_228 = ReadAttribute<float>(this,anZ);
          uStack_230 = CONCAT44(local_200._4_4_,local_200._0_4_);
          axis_00.z = local_228;
          axis_00.x = (float)local_200._0_4_;
          axis_00.y = (float)local_200._4_4_;
          local_220 = uStack_230;
          local_218 = local_228;
          axis.x = local_228;
          aiQuaterniont<float>::aiQuaterniont(&local_210,axis_00,local_54);
          (local_20->rotation).w = local_210.w;
          (local_20->rotation).x = local_210.x;
          (local_20->rotation).y = local_210.y;
          (local_20->rotation).z = local_210.z;
        }
        else {
          bVar1 = std::operator==(&this->m_currentNodeName,nnScale);
          if (bVar1) {
            bVar1 = HasAttribute(this,"factor");
            if (bVar1) {
              local_234 = ReadAttribute<float>(this,"factor");
              aiVector3t<float>::Set(&local_20->scale,local_234,local_234,local_234);
            }
            else {
              bVar1 = HasAttribute(this,anX);
              if (bVar1) {
                fVar8 = ReadAttribute<float>(this,anX);
                (local_20->scale).x = fVar8;
              }
              bVar1 = HasAttribute(this,anY);
              if (bVar1) {
                fVar8 = ReadAttribute<float>(this,anY);
                (local_20->scale).y = fVar8;
              }
              bVar1 = HasAttribute(this,anZ);
              if (bVar1) {
                fVar8 = ReadAttribute<float>(this,anZ);
                (local_20->scale).z = fVar8;
              }
            }
          }
        }
      }
      NextNode_abi_cxx11_(this);
    }
    std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::push_back
              ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)bone,&local_20
              );
  } while( true );
}

Assistant:

void OgreXmlSerializer::ReadBones(Skeleton *skeleton)
{
    ASSIMP_LOG_DEBUG("  - Bones");

    NextNode();
    while(m_currentNodeName == nnBone)
    {
        Bone *bone = new Bone();
        bone->id = ReadAttribute<uint16_t>("id");
        bone->name = ReadAttribute<std::string>("name");

        NextNode();
        while(m_currentNodeName == nnPosition ||
              m_currentNodeName == nnRotation ||
              m_currentNodeName == nnScale)
        {
            if (m_currentNodeName == nnPosition)
            {
                bone->position.x = ReadAttribute<float>(anX);
                bone->position.y = ReadAttribute<float>(anY);
                bone->position.z = ReadAttribute<float>(anZ);
            }
            else if (m_currentNodeName == nnRotation)
            {
                float angle = ReadAttribute<float>("angle");

                if (NextNode() != nnAxis) {
                    throw DeadlyImportError(Formatter::format() << "No axis specified for bone rotation in bone " << bone->id);
                }

                aiVector3D axis;
                axis.x = ReadAttribute<float>(anX);
                axis.y = ReadAttribute<float>(anY);
                axis.z = ReadAttribute<float>(anZ);

                bone->rotation = aiQuaternion(axis, angle);
            }
            else if (m_currentNodeName == nnScale)
            {
                /// @todo Implement taking scale into account in matrix/pose calculations!
                if (HasAttribute("factor"))
                {
                    float factor = ReadAttribute<float>("factor");
                    bone->scale.Set(factor, factor, factor);
                }
                else
                {
                    if (HasAttribute(anX))
                        bone->scale.x = ReadAttribute<float>(anX);
                    if (HasAttribute(anY))
                        bone->scale.y = ReadAttribute<float>(anY);
                    if (HasAttribute(anZ))
                        bone->scale.z = ReadAttribute<float>(anZ);
                }
            }

            NextNode();
        }

        skeleton->bones.push_back(bone);
    }

    // Order bones by Id
    std::sort(skeleton->bones.begin(), skeleton->bones.end(), BoneCompare);

    // Validate that bone indexes are not skipped.
    /** @note Left this from original authors code, but not sure if this is strictly necessary
        as per the Ogre skeleton spec. It might be more that other (later) code in this imported does not break. */
    for (size_t i=0, len=skeleton->bones.size(); i<len; ++i)
    {
        Bone *b = skeleton->bones[i];
        ASSIMP_LOG_DEBUG_F( "    ", b->id, " ", b->name);

        if (b->id != static_cast<uint16_t>(i)) {
            throw DeadlyImportError(Formatter::format() << "Bone ids are not in sequence starting from 0. Missing index " << i);
        }
    }
}